

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void roaring_bitmap_lazy_or_inplace
               (roaring_bitmap_t *x1,roaring_bitmap_t *x2,_Bool bitsetconversion)

{
  int iVar1;
  int iVar2;
  container_t *c;
  ulong uVar3;
  array_container_t *sc;
  array_container_t *paVar4;
  uint8_t uVar5;
  uint16_t *puVar6;
  undefined7 in_register_00000011;
  int iVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  uint8_t uVar12;
  uint16_t key;
  roaring_array_t *ra;
  uint8_t type1;
  uint8_t type2;
  uint8_t result_type;
  uint8_t local_93;
  uint8_t local_92;
  uint8_t local_91;
  ulong local_90;
  int local_84;
  array_container_t *local_80;
  ulong local_78;
  array_container_t *local_70;
  roaring_array_t *local_68;
  undefined4 local_5c;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  long local_40;
  long local_38;
  
  local_91 = '\0';
  local_84 = (x2->high_low_container).size;
  if (local_84 == 0) {
    return;
  }
  uVar10 = (x1->high_low_container).size;
  if (uVar10 == 0) {
    (x1->high_low_container).flags =
         (x1->high_low_container).flags & 0xfe | (x2->high_low_container).flags & 1;
    ra_overwrite(&x2->high_low_container,&x1->high_low_container,
                 (_Bool)((x2->high_low_container).flags & 1));
    return;
  }
  local_5c = (undefined4)CONCAT71(in_register_00000011,bitsetconversion);
  puVar6 = (x1->high_low_container).keys;
  key = *(x2->high_low_container).keys;
  local_58 = (ulong)(1 - local_84);
  local_48 = 0;
  uVar3 = 0;
  local_68 = &x1->high_low_container;
  do {
    local_78 = (ulong)uVar10;
    local_80 = (array_container_t *)CONCAT62(local_80._2_6_,*puVar6);
    iVar7 = (int)local_48;
    uVar9 = local_48 & 0xffffffff;
    local_70 = (array_container_t *)(local_58 + uVar9);
    local_38 = (long)iVar7;
    local_40 = local_38 * 8;
    local_90 = uVar3 & 0xffffffff;
    lVar8 = 0;
    while( true ) {
      ra = local_68;
      iVar2 = (int)local_90;
      iVar1 = (int)lVar8;
      iVar11 = (int)local_78;
      if ((ushort)local_80 == key) break;
      if ((ushort)local_80 < key) {
        uVar3 = local_90 + lVar8 + 1;
        if (iVar11 + iVar1 != (uint)uVar3) {
          puVar6 = (uint16_t *)((ulong)(((uint)uVar3 & 0xffff) * 2) + (long)local_68->keys);
          local_48 = (ulong)(uint)(iVar7 + iVar1);
          goto LAB_0010a53a;
        }
        iVar7 = iVar1 + iVar7;
        goto LAB_0010a566;
      }
      uVar3 = uVar9 + lVar8 & 0xffff;
      local_92 = (x2->high_low_container).typecodes[uVar3];
      c = get_copy_of_container
                    ((x2->high_low_container).containers[uVar3],&local_92,
                     (_Bool)((x2->high_low_container).flags & 1));
      ra = local_68;
      if (((x2->high_low_container).flags & 1) != 0) {
        *(container_t **)((long)(x2->high_low_container).containers + lVar8 * 8 + local_40) = c;
        (x2->high_low_container).typecodes[lVar8 + local_38] = local_92;
      }
      ra_insert_new_key_value_at(local_68,iVar2 + iVar1,key,c,local_92);
      if ((int)local_70 + iVar1 == 0) {
        iVar2 = (int)local_90;
        iVar11 = (int)local_78 + iVar1 + 1;
        iVar7 = local_84;
        goto LAB_0010a561;
      }
      key = (x2->high_low_container).keys[(ushort)((short)uVar9 + (short)lVar8 + 1)];
      lVar8 = lVar8 + 1;
    }
    uVar10 = iVar2 + iVar1 & 0xffff;
    uVar12 = local_68->typecodes[uVar10];
    sc = (array_container_t *)local_68->containers[uVar10];
    paVar4 = sc;
    uVar5 = uVar12;
    if (uVar12 == '\x04') {
      uVar5 = *(uint8_t *)&sc->array;
      paVar4 = *(array_container_t **)sc;
    }
    local_93 = uVar12;
    if (uVar5 == '\x03') {
      if (((paVar4->cardinality != 1) || (*paVar4->array != 0)) || (paVar4->array[1] != 0xffff))
      goto LAB_0010a3e6;
    }
    else if (paVar4->cardinality != 0x10000) {
LAB_0010a3e6:
      local_50 = uVar9;
      if ((char)local_5c == '\0') {
        if (uVar12 == '\x04') {
LAB_0010a40e:
          sc = (array_container_t *)
               shared_container_extract_copy((shared_container_t *)sc,&local_93);
          uVar12 = local_93;
        }
      }
      else {
        if (uVar12 == '\x04') {
          if (*(uint8_t *)&sc->array == '\x01') goto LAB_0010a40e;
          paVar4 = *(array_container_t **)sc;
          local_93 = *(uint8_t *)&sc->array;
        }
        else {
          paVar4 = sc;
          if (uVar12 == '\x01') {
            uVar12 = '\x01';
            goto LAB_0010a484;
          }
        }
        if (local_93 != '\x01') {
          local_70 = sc;
          if (local_93 == '\x03') {
            paVar4 = (array_container_t *)bitset_container_from_run((run_container_t *)paVar4);
            sc = local_70;
          }
          else {
            paVar4 = (array_container_t *)bitset_container_from_array(paVar4);
            sc = local_70;
          }
        }
        local_80 = paVar4;
        container_free(sc,uVar12);
        local_93 = '\x01';
        sc = local_80;
        uVar12 = '\x01';
      }
LAB_0010a484:
      uVar3 = uVar9 + lVar8 & 0xffff;
      local_92 = (x2->high_low_container).typecodes[uVar3];
      paVar4 = (array_container_t *)
               container_lazy_ior(sc,uVar12,(x2->high_low_container).containers[uVar3],local_92,
                                  &local_91);
      if (paVar4 != sc) {
        container_free(sc,local_93);
      }
      ra->containers[(int)local_90 + lVar8] = paVar4;
      ra->typecodes[lVar8 + (int)local_90] = local_91;
      uVar9 = local_50;
    }
    uVar3 = local_90 + lVar8 + 1;
    if ((iVar11 + iVar1 == (uint)uVar3) || (iVar1 + (int)local_58 + (int)uVar9 == 0)) {
      iVar7 = (int)local_48 + iVar1 + 1;
      iVar2 = (int)local_90;
      iVar11 = iVar11 + iVar1;
LAB_0010a561:
      if (iVar2 + iVar1 + 1 != iVar11) {
        return;
      }
LAB_0010a566:
      ra_append_copy_range
                (ra,&x2->high_low_container,iVar7,local_84,
                 (_Bool)((x2->high_low_container).flags & 1));
      return;
    }
    local_48 = uVar9 + lVar8 + 1;
    puVar6 = (uint16_t *)((ulong)(((uint)uVar3 & 0xffff) * 2) + (long)ra->keys);
    key = (x2->high_low_container).keys[(uint)local_48 & 0xffff];
LAB_0010a53a:
    uVar10 = iVar11 + iVar1;
  } while( true );
}

Assistant:

void roaring_bitmap_lazy_or_inplace(roaring_bitmap_t *x1,
                                    const roaring_bitmap_t *x2,
                                    const bool bitsetconversion) {
    uint8_t result_type = 0;
    int length1 = x1->high_low_container.size;
    const int length2 = x2->high_low_container.size;

    if (0 == length2) return;

    if (0 == length1) {
        roaring_bitmap_overwrite(x1, x2);
        return;
    }
    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            if (!container_is_full(c1, type1)) {
                if ((bitsetconversion == false) ||
                    (get_container_type(c1, type1) == BITSET_CONTAINER_TYPE)) {
                    c1 = get_writable_copy_if_shared(c1, &type1);
                } else {
                    // convert to bitset
                    container_t *old_c1 = c1;
                    uint8_t old_type1 = type1;
                    c1 = container_mutable_unwrap_shared(c1, &type1);
                    c1 = container_to_bitset(c1, type1);
                    container_free(old_c1, old_type1);
                    type1 = BITSET_CONTAINER_TYPE;
                }

                container_t *c2 = ra_get_container_at_index(
                    &x2->high_low_container, (uint16_t)pos2, &type2);
                container_t *c =
                    container_lazy_ior(c1, type1, c2, type2, &result_type);

                if (c != c1) {  // in this instance a new container was created,
                                // and we need to free the old one
                    container_free(c1, type1);
                }

                ra_set_container_at_index(&x1->high_low_container, pos1, c,
                                          result_type);
            }
            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        } else if (s1 < s2) {  // s1 < s2
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);

        } else {  // s1 > s2
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            // container_t *c2_clone = container_clone(c2, type2);
            c2 = get_copy_of_container(c2, &type2, is_cow(x2));
            if (is_cow(x2)) {
                ra_set_container_at_index(&x2->high_low_container, pos2, c2,
                                          type2);
            }
            ra_insert_new_key_value_at(&x1->high_low_container, pos1, s2, c2,
                                       type2);
            pos1++;
            length1++;
            pos2++;
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
        }
    }
    if (pos1 == length1) {
        ra_append_copy_range(&x1->high_low_container, &x2->high_low_container,
                             pos2, length2, is_cow(x2));
    }
}